

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::writeDescriptors(IsoWriter *this)

{
  long lVar1;
  int64_t iVar2;
  size_t __n;
  int64_t fullFileSize;
  int64_t eofPos;
  IsoWriter *this_local;
  
  this->m_tagLocationBaseAddr = 0;
  File::seek(&this->m_file,0x10000,smBegin);
  writePrimaryVolumeDescriptor(this);
  writeImpUseDescriptor(this);
  writePartitionDescriptor(this);
  writeLogicalVolumeDescriptor(this);
  writeUnallocatedSpaceDescriptor(this);
  writeTerminationDescriptor(this);
  File::seek(&this->m_file,0x20000,smBegin);
  writeLogicalVolumeIntegrityDescriptor(this);
  writeTerminationDescriptor(this);
  File::seek(&this->m_file,0x80000,smBegin);
  writeAnchorVolumeDescriptor(this,this->m_partitionEndAddress + 0x20);
  lVar1 = (long)this->m_partitionEndAddress * 0x800;
  File::seek(&this->m_file,lVar1 + 0xf800,smBegin);
  writeAnchorVolumeDescriptor(this,this->m_partitionEndAddress + 0x20);
  writePrimaryVolumeDescriptor(this);
  writeImpUseDescriptor(this);
  writePartitionDescriptor(this);
  writeLogicalVolumeDescriptor(this);
  writeUnallocatedSpaceDescriptor(this);
  writeTerminationDescriptor(this);
  memset(this->m_buffer,0,0x800);
  while( true ) {
    iVar2 = File::size(&this->m_file);
    __n = lVar1 + 0x8f800;
    if ((long)__n <= iVar2) break;
    File::write(&this->m_file,(int)this + 0xa0,(void *)0x800,__n);
  }
  writeAnchorVolumeDescriptor(this,this->m_partitionEndAddress + 0x20);
  return;
}

Assistant:

void IsoWriter::writeDescriptors()
{
    m_tagLocationBaseAddr = 0;
    // descriptors in a beginning of a file
    m_file.seek(1024LL * 64);

    writePrimaryVolumeDescriptor();
    writeImpUseDescriptor();
    writePartitionDescriptor();
    writeLogicalVolumeDescriptor();
    writeUnallocatedSpaceDescriptor();
    writeTerminationDescriptor();

    m_file.seek(1024LL * 128);

    writeLogicalVolumeIntegrityDescriptor();
    writeTerminationDescriptor();

    m_file.seek(1024LL * 512);

    writeAnchorVolumeDescriptor(m_partitionEndAddress +
                                ALLOC_BLOCK_SIZE / SECTOR_SIZE);  // add space for last 64K anchor volume

    // descriptors in a end of a file

    const int64_t eofPos = m_partitionEndAddress * static_cast<int64_t>(SECTOR_SIZE);
    m_file.seek(eofPos + ALLOC_BLOCK_SIZE - SECTOR_SIZE);
    // TODO: It may be preferable not to include the AVDP at (N - 256) for Rewritable media (ditto DVDFab and ImgBurn)
    writeAnchorVolumeDescriptor(m_partitionEndAddress + ALLOC_BLOCK_SIZE / SECTOR_SIZE);

    writePrimaryVolumeDescriptor();
    writeImpUseDescriptor();
    writePartitionDescriptor();
    writeLogicalVolumeDescriptor();
    writeUnallocatedSpaceDescriptor();
    writeTerminationDescriptor();

    memset(m_buffer, 0, sizeof(m_buffer));
    const int64_t fullFileSize = eofPos + static_cast<int64_t>(1024 * 512) + ALLOC_BLOCK_SIZE;
    while (m_file.size() < fullFileSize - SECTOR_SIZE) m_file.write(m_buffer, SECTOR_SIZE);
    writeAnchorVolumeDescriptor(m_partitionEndAddress + ALLOC_BLOCK_SIZE / SECTOR_SIZE);
}